

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_ul_setup(Curl_easy *data,_Bool sizechecked)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  size_t sVar4;
  char *fmt;
  bool bVar5;
  ulong local_1060;
  size_t actuallyread;
  size_t readthisamountnow;
  char scratch [4096];
  curl_off_t passed;
  int seekerr;
  _Bool append;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *conn;
  CURLcode result;
  _Bool sizechecked_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.file;
  bVar5 = (*(ulong *)&(data->set).field_0x8ca >> 10 & 1) != 0;
  if ((((data->state).resume_from != 0) && (!sizechecked)) ||
     ((0 < (data->state).resume_from && (sizechecked)))) {
    passed._0_4_ = 0;
    if ((data->state).resume_from < 0) {
      CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"SIZE %s",(pcVar1->proto).ftpc.file);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      _ftp_state(data,'\x19');
      return CURLE_OK;
    }
    bVar5 = true;
    if ((data->set).seek_func != (curl_seek_callback)0x0) {
      Curl_set_in_callback(data,true);
      passed._0_4_ = (*(data->set).seek_func)((data->set).seek_client,(data->state).resume_from,0);
      Curl_set_in_callback(data,false);
    }
    if ((int)passed != 0) {
      scratch[0xff8] = '\0';
      scratch[0xff9] = '\0';
      scratch[0xffa] = '\0';
      scratch[0xffb] = '\0';
      scratch[0xffc] = '\0';
      scratch[0xffd] = '\0';
      scratch[0xffe] = '\0';
      scratch[0xfff] = '\0';
      if ((int)passed != 2) {
        Curl_failf(data,"Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      do {
        if ((data->state).resume_from - scratch._4088_8_ < 0x1001) {
          local_1060 = curlx_sotouz((data->state).resume_from - scratch._4088_8_);
        }
        else {
          local_1060 = 0x1000;
        }
        sVar4 = (*(data->state).fread_func)
                          ((char *)&readthisamountnow,1,local_1060,(data->state).in);
        scratch._4088_8_ = sVar4 + scratch._4088_8_;
        if ((sVar4 == 0) || (local_1060 < sVar4)) {
          Curl_failf(data,"Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while ((long)scratch._4088_8_ < (data->state).resume_from);
    }
    if ((0 < (data->state).infilesize) &&
       ((data->state).infilesize = (data->state).infilesize - (data->state).resume_from,
       (data->state).infilesize < 1)) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"File already completely uploaded");
      }
      Curl_xfer_setup_nop(data);
      pFVar2->fd = 2;
      _ftp_state(data,'\0');
      return CURLE_OK;
    }
  }
  fmt = "STOR %s";
  if (bVar5) {
    fmt = "APPE %s";
  }
  CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,fmt,(pcVar1->proto).ftpc.file);
  if (CVar3 == CURLE_OK) {
    _ftp_state(data,'!');
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct Curl_easy *data,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool append = data->set.remote_append;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we are about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       do not another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
      if(!result)
        ftp_state(data, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(data->set.seek_func) {
      Curl_set_in_callback(data, TRUE);
      seekerr = data->set.seek_func(data->set.seek_client,
                                    data->state.resume_from, SEEK_SET);
      Curl_set_in_callback(data, FALSE);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (cannot seek to offset) */
      do {
        char scratch[4*1024];
        size_t readthisamountnow =
          (data->state.resume_from - passed > (curl_off_t)sizeof(scratch)) ?
          sizeof(scratch) :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(scratch, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize > 0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded");

        /* no data to transfer */
        Curl_xfer_setup_nop(data);

        /* Set ->transfer so that we will not get any error in
         * ftp_done() because we did not transfer anything! */
        ftp->transfer = PPTRANSFER_NONE;

        ftp_state(data, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we have passed, proceed as normal */
  } /* resume_from */

  result = Curl_pp_sendf(data, &ftpc->pp, append ? "APPE %s" : "STOR %s",
                         ftpc->file);
  if(!result)
    ftp_state(data, FTP_STOR);

  return result;
}